

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::BVHNIntersector1<4,_16781328,_false,_embree::sse42::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  char cVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  NodeRef *pNVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 uVar23;
  ulong unaff_R15;
  undefined4 uVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float fVar37;
  float fVar39;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar38;
  float fVar40;
  float fVar41;
  undefined1 auVar36 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vfloat4 a0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  float fVar60;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar78;
  float fVar79;
  vint4 ai;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  vint4 bi;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  vint4 ai_1;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  Precalculations pre;
  NodeRef stack [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar5 = ray->tfar, 0.0 <= fVar5)) {
    aVar6 = (ray->dir).field_0.field_1;
    fVar83 = aVar6.x;
    fVar85 = aVar6.y;
    fVar87 = aVar6.z;
    auVar28 = dpps((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar49 = rsqrtss(auVar28,auVar28);
    fVar26 = auVar49._0_4_;
    pre.depth_scale = fVar26 * 1.5 - fVar26 * fVar26 * auVar28._0_4_ * 0.5 * fVar26;
    auVar50._0_4_ = fVar83 * pre.depth_scale;
    auVar50._4_4_ = fVar85 * pre.depth_scale;
    auVar50._8_4_ = fVar87 * pre.depth_scale;
    auVar50._12_4_ = aVar6.field_3.w * pre.depth_scale;
    uVar20 = CONCAT44(auVar50._4_4_,auVar50._4_4_);
    auVar29._0_8_ = uVar20 ^ 0x8000000080000000;
    auVar29._8_4_ = -auVar50._12_4_;
    auVar29._12_4_ = -auVar50._12_4_;
    auVar61._0_12_ = ZEXT812(0);
    auVar61._12_4_ = 0;
    auVar29 = blendps(auVar29,auVar61,0xe);
    auVar28._4_4_ = auVar29._0_4_;
    auVar28._0_4_ = auVar50._8_4_;
    auVar28._8_4_ = auVar29._4_4_;
    auVar28._12_4_ = 0;
    auVar49._4_4_ = auVar29._0_4_;
    auVar49._0_4_ = auVar50._8_4_;
    auVar49._8_4_ = auVar29._4_4_;
    auVar49._12_4_ = 0;
    auVar81 = dpps(auVar49 << 0x20,auVar28 << 0x20,0x7f);
    uVar20 = CONCAT44(auVar50._12_4_,auVar50._8_4_);
    auVar69._0_8_ = uVar20 ^ 0x8000000080000000;
    auVar69._8_4_ = -auVar50._8_4_;
    auVar69._12_4_ = -auVar50._12_4_;
    auVar29 = insertps(auVar69,auVar50,0x2a);
    auVar49 = dpps(auVar29,auVar29,0x7f);
    iVar25 = -(uint)(auVar49._0_4_ < auVar81._0_4_);
    auVar81._4_4_ = iVar25;
    auVar81._0_4_ = iVar25;
    auVar81._8_4_ = iVar25;
    auVar81._12_4_ = iVar25;
    auVar28 = blendvps(auVar29,auVar28 << 0x20,auVar81);
    auVar49 = dpps(auVar28,auVar28,0x7f);
    auVar29 = rsqrtss(auVar49,auVar49);
    fVar26 = auVar29._0_4_;
    fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * auVar49._0_4_ * 0.5 * fVar26;
    fVar27 = fVar26 * auVar28._0_4_;
    fVar37 = fVar26 * auVar28._4_4_;
    fVar39 = fVar26 * auVar28._8_4_;
    fVar26 = fVar26 * auVar28._12_4_;
    fVar68 = fVar37 * auVar50._0_4_ - auVar50._4_4_ * fVar27;
    fVar71 = fVar39 * auVar50._4_4_ - auVar50._8_4_ * fVar37;
    fVar72 = fVar27 * auVar50._8_4_ - auVar50._0_4_ * fVar39;
    auVar70._12_4_ = fVar26 * auVar50._12_4_ - auVar50._12_4_ * fVar26;
    auVar70._0_8_ = CONCAT44(fVar72,fVar71);
    auVar70._8_4_ = fVar68;
    auVar76._8_4_ = fVar68;
    auVar76._0_8_ = auVar70._0_8_;
    auVar76._12_4_ = auVar70._12_4_;
    auVar28 = dpps(auVar76,auVar70,0x7f);
    auVar49 = rsqrtss(auVar28,auVar28);
    fVar26 = auVar49._0_4_;
    fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * auVar28._0_4_ * 0.5 * fVar26;
    pre.ray_space.vz.field_0.m128[1] = fVar26 * fVar68;
    pre.ray_space.vz.field_0.m128[0] = fVar39;
    pre.ray_space.vz.field_0.m128[2] = auVar50._8_4_ * pre.depth_scale;
    pre.ray_space.vz.field_0.m128[3] = 0.0;
    pre.ray_space.vx.field_0.m128[1] = fVar26 * fVar71;
    pre.ray_space.vx.field_0.m128[0] = fVar27;
    pre.ray_space.vx.field_0.m128[2] = auVar50._0_4_ * pre.depth_scale;
    pre.ray_space.vx.field_0.m128[3] = 0.0;
    pre.ray_space.vy.field_0.m128[1] = fVar26 * fVar72;
    pre.ray_space.vy.field_0.m128[0] = fVar37;
    pre.ray_space.vy.field_0.m128[2] = auVar50._4_4_ * pre.depth_scale;
    pre.ray_space.vy.field_0.m128[3] = 0.0;
    pNVar19 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar37 = (ray->org).field_0.m128[0];
    fVar39 = (ray->org).field_0.m128[1];
    fVar68 = (ray->org).field_0.m128[2];
    fVar26 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar27 = 0.0;
    if (0.0 <= fVar26) {
      fVar27 = fVar26;
    }
    auVar30._4_4_ = -(uint)(ABS(fVar85) < DAT_01ff1d40._4_4_);
    auVar30._0_4_ = -(uint)(ABS(fVar83) < (float)DAT_01ff1d40);
    auVar30._8_4_ = -(uint)(ABS(fVar87) < DAT_01ff1d40._8_4_);
    auVar30._12_4_ = -(uint)(ABS(aVar6.field_3.w) < DAT_01ff1d40._12_4_);
    auVar49 = blendvps((undefined1  [16])aVar6,_DAT_01ff1d40,auVar30);
    auVar28 = rcpps(auVar30,auVar49);
    fVar26 = auVar28._0_4_;
    fVar71 = auVar28._4_4_;
    fVar72 = auVar28._8_4_;
    fVar26 = (1.0 - auVar49._0_4_ * fVar26) * fVar26 + fVar26;
    fVar71 = (1.0 - auVar49._4_4_ * fVar71) * fVar71 + fVar71;
    fVar72 = (1.0 - auVar49._8_4_ * fVar72) * fVar72 + fVar72;
    uVar20 = (ulong)(fVar26 < 0.0) * 0x10;
    uVar21 = (ulong)(fVar71 < 0.0) << 4 | 0x20;
    uVar22 = (ulong)(fVar72 < 0.0) << 4 | 0x40;
    auVar77._4_4_ = fVar27;
    auVar77._0_4_ = fVar27;
    auVar77._8_4_ = fVar27;
    auVar77._12_4_ = fVar27;
    do {
      if (pNVar19 == stack) {
        return;
      }
      uVar15 = pNVar19[-1].ptr;
      pNVar19 = pNVar19 + -1;
      do {
        if ((uVar15 & 8) == 0) {
          fVar27 = (ray->dir).field_0.m128[3];
          uVar16 = (uint)uVar15 & 7;
          uVar13 = uVar15 & 0xfffffffffffffff0;
          uVar24 = (undefined4)(unaff_R15 >> 0x20);
          if (uVar16 == 3) {
            fVar73 = 1.0 - fVar27;
            fVar74 = fVar73 * 0.0;
            auVar56._0_4_ =
                 fVar83 * *(float *)(uVar13 + 0x20) +
                 fVar85 * *(float *)(uVar13 + 0x50) + fVar87 * *(float *)(uVar13 + 0x80);
            auVar56._4_4_ =
                 fVar83 * *(float *)(uVar13 + 0x24) +
                 fVar85 * *(float *)(uVar13 + 0x54) + fVar87 * *(float *)(uVar13 + 0x84);
            auVar56._8_4_ =
                 fVar83 * *(float *)(uVar13 + 0x28) +
                 fVar85 * *(float *)(uVar13 + 0x58) + fVar87 * *(float *)(uVar13 + 0x88);
            auVar56._12_4_ =
                 fVar83 * *(float *)(uVar13 + 0x2c) +
                 fVar85 * *(float *)(uVar13 + 0x5c) + fVar87 * *(float *)(uVar13 + 0x8c);
            auVar45._0_4_ =
                 fVar83 * *(float *)(uVar13 + 0x30) +
                 fVar85 * *(float *)(uVar13 + 0x60) + fVar87 * *(float *)(uVar13 + 0x90);
            auVar45._4_4_ =
                 fVar83 * *(float *)(uVar13 + 0x34) +
                 fVar85 * *(float *)(uVar13 + 100) + fVar87 * *(float *)(uVar13 + 0x94);
            auVar45._8_4_ =
                 fVar83 * *(float *)(uVar13 + 0x38) +
                 fVar85 * *(float *)(uVar13 + 0x68) + fVar87 * *(float *)(uVar13 + 0x98);
            auVar45._12_4_ =
                 fVar83 * *(float *)(uVar13 + 0x3c) +
                 fVar85 * *(float *)(uVar13 + 0x6c) + fVar87 * *(float *)(uVar13 + 0x9c);
            auVar53._0_4_ =
                 fVar83 * *(float *)(uVar13 + 0x40) +
                 fVar85 * *(float *)(uVar13 + 0x70) + fVar87 * *(float *)(uVar13 + 0xa0);
            auVar53._4_4_ =
                 fVar83 * *(float *)(uVar13 + 0x44) +
                 fVar85 * *(float *)(uVar13 + 0x74) + fVar87 * *(float *)(uVar13 + 0xa4);
            auVar53._8_4_ =
                 fVar83 * *(float *)(uVar13 + 0x48) +
                 fVar85 * *(float *)(uVar13 + 0x78) + fVar87 * *(float *)(uVar13 + 0xa8);
            auVar53._12_4_ =
                 fVar83 * *(float *)(uVar13 + 0x4c) +
                 fVar85 * *(float *)(uVar13 + 0x7c) + fVar87 * *(float *)(uVar13 + 0xac);
            fVar60 = (float)DAT_01ff1d40;
            fVar63 = DAT_01ff1d40._4_4_;
            fVar64 = DAT_01ff1d40._8_4_;
            fVar66 = DAT_01ff1d40._12_4_;
            auVar33._4_4_ = -(uint)(ABS(auVar56._4_4_) < fVar63);
            auVar33._0_4_ = -(uint)(ABS(auVar56._0_4_) < fVar60);
            auVar33._8_4_ = -(uint)(ABS(auVar56._8_4_) < fVar64);
            auVar33._12_4_ = -(uint)(ABS(auVar56._12_4_) < fVar66);
            auVar81 = blendvps(auVar56,_DAT_01ff1d40,auVar33);
            auVar34._4_4_ = -(uint)(ABS(auVar45._4_4_) < fVar63);
            auVar34._0_4_ = -(uint)(ABS(auVar45._0_4_) < fVar60);
            auVar34._8_4_ = -(uint)(ABS(auVar45._8_4_) < fVar64);
            auVar34._12_4_ = -(uint)(ABS(auVar45._12_4_) < fVar66);
            auVar49 = blendvps(auVar45,_DAT_01ff1d40,auVar34);
            auVar35._4_4_ = -(uint)(ABS(auVar53._4_4_) < fVar63);
            auVar35._0_4_ = -(uint)(ABS(auVar53._0_4_) < fVar60);
            auVar35._8_4_ = -(uint)(ABS(auVar53._8_4_) < fVar64);
            auVar35._12_4_ = -(uint)(ABS(auVar53._12_4_) < fVar66);
            auVar29 = blendvps(auVar53,_DAT_01ff1d40,auVar35);
            auVar28 = rcpps(auVar35,auVar81);
            fVar60 = auVar28._0_4_;
            fVar66 = auVar28._4_4_;
            fVar65 = auVar28._8_4_;
            fVar67 = auVar28._12_4_;
            fVar60 = (1.0 - auVar81._0_4_ * fVar60) * fVar60 + fVar60;
            fVar66 = (1.0 - auVar81._4_4_ * fVar66) * fVar66 + fVar66;
            fVar65 = (1.0 - auVar81._8_4_ * fVar65) * fVar65 + fVar65;
            fVar67 = (1.0 - auVar81._12_4_ * fVar67) * fVar67 + fVar67;
            auVar28 = rcpps(auVar28,auVar49);
            fVar63 = auVar28._0_4_;
            auVar46._0_4_ = auVar49._0_4_ * fVar63;
            fVar57 = auVar28._4_4_;
            auVar46._4_4_ = auVar49._4_4_ * fVar57;
            fVar58 = auVar28._8_4_;
            auVar46._8_4_ = auVar49._8_4_ * fVar58;
            fVar59 = auVar28._12_4_;
            auVar46._12_4_ = auVar49._12_4_ * fVar59;
            fVar63 = (1.0 - auVar46._0_4_) * fVar63 + fVar63;
            fVar57 = (1.0 - auVar46._4_4_) * fVar57 + fVar57;
            fVar58 = (1.0 - auVar46._8_4_) * fVar58 + fVar58;
            fVar59 = (1.0 - auVar46._12_4_) * fVar59 + fVar59;
            auVar28 = rcpps(auVar46,auVar29);
            fVar64 = auVar28._0_4_;
            fVar38 = auVar28._4_4_;
            fVar40 = auVar28._8_4_;
            fVar41 = auVar28._12_4_;
            fVar64 = (1.0 - auVar29._0_4_ * fVar64) * fVar64 + fVar64;
            fVar38 = (1.0 - auVar29._4_4_ * fVar38) * fVar38 + fVar38;
            fVar40 = (1.0 - auVar29._8_4_ * fVar40) * fVar40 + fVar40;
            fVar41 = (1.0 - auVar29._12_4_ * fVar41) * fVar41 + fVar41;
            fVar90 = *(float *)(uVar13 + 0x20) * fVar37 +
                     *(float *)(uVar13 + 0x50) * fVar39 +
                     *(float *)(uVar13 + 0x80) * fVar68 + *(float *)(uVar13 + 0xb0);
            fVar91 = *(float *)(uVar13 + 0x24) * fVar37 +
                     *(float *)(uVar13 + 0x54) * fVar39 +
                     *(float *)(uVar13 + 0x84) * fVar68 + *(float *)(uVar13 + 0xb4);
            fVar92 = *(float *)(uVar13 + 0x28) * fVar37 +
                     *(float *)(uVar13 + 0x58) * fVar39 +
                     *(float *)(uVar13 + 0x88) * fVar68 + *(float *)(uVar13 + 0xb8);
            fVar93 = *(float *)(uVar13 + 0x2c) * fVar37 +
                     *(float *)(uVar13 + 0x5c) * fVar39 +
                     *(float *)(uVar13 + 0x8c) * fVar68 + *(float *)(uVar13 + 0xbc);
            fVar94 = *(float *)(uVar13 + 0x30) * fVar37 +
                     *(float *)(uVar13 + 0x60) * fVar39 +
                     *(float *)(uVar13 + 0x90) * fVar68 + *(float *)(uVar13 + 0xc0);
            fVar95 = *(float *)(uVar13 + 0x34) * fVar37 +
                     *(float *)(uVar13 + 100) * fVar39 +
                     *(float *)(uVar13 + 0x94) * fVar68 + *(float *)(uVar13 + 0xc4);
            fVar96 = *(float *)(uVar13 + 0x38) * fVar37 +
                     *(float *)(uVar13 + 0x68) * fVar39 +
                     *(float *)(uVar13 + 0x98) * fVar68 + *(float *)(uVar13 + 200);
            fVar97 = *(float *)(uVar13 + 0x3c) * fVar37 +
                     *(float *)(uVar13 + 0x6c) * fVar39 +
                     *(float *)(uVar13 + 0x9c) * fVar68 + *(float *)(uVar13 + 0xcc);
            fVar98 = *(float *)(uVar13 + 0x40) * fVar37 +
                     *(float *)(uVar13 + 0x70) * fVar39 +
                     *(float *)(uVar13 + 0xa0) * fVar68 + *(float *)(uVar13 + 0xd0);
            fVar99 = *(float *)(uVar13 + 0x44) * fVar37 +
                     *(float *)(uVar13 + 0x74) * fVar39 +
                     *(float *)(uVar13 + 0xa4) * fVar68 + *(float *)(uVar13 + 0xd4);
            fVar100 = *(float *)(uVar13 + 0x48) * fVar37 +
                      *(float *)(uVar13 + 0x78) * fVar39 +
                      *(float *)(uVar13 + 0xa8) * fVar68 + *(float *)(uVar13 + 0xd8);
            fVar101 = *(float *)(uVar13 + 0x4c) * fVar37 +
                      *(float *)(uVar13 + 0x7c) * fVar39 +
                      *(float *)(uVar13 + 0xac) * fVar68 + *(float *)(uVar13 + 0xdc);
            fVar84 = ((*(float *)(uVar13 + 0xe0) * fVar27 + fVar74) - fVar90) * fVar60;
            fVar86 = ((*(float *)(uVar13 + 0xe4) * fVar27 + fVar74) - fVar91) * fVar66;
            fVar88 = ((*(float *)(uVar13 + 0xe8) * fVar27 + fVar74) - fVar92) * fVar65;
            fVar89 = ((*(float *)(uVar13 + 0xec) * fVar27 + fVar74) - fVar93) * fVar67;
            fVar60 = ((*(float *)(uVar13 + 0x110) * fVar27 + fVar73) - fVar90) * fVar60;
            fVar66 = ((*(float *)(uVar13 + 0x114) * fVar27 + fVar73) - fVar91) * fVar66;
            fVar65 = ((*(float *)(uVar13 + 0x118) * fVar27 + fVar73) - fVar92) * fVar65;
            fVar67 = ((*(float *)(uVar13 + 0x11c) * fVar27 + fVar73) - fVar93) * fVar67;
            fVar90 = ((*(float *)(uVar13 + 0xf0) * fVar27 + fVar74) - fVar94) * fVar63;
            fVar91 = ((*(float *)(uVar13 + 0xf4) * fVar27 + fVar74) - fVar95) * fVar57;
            fVar92 = ((*(float *)(uVar13 + 0xf8) * fVar27 + fVar74) - fVar96) * fVar58;
            fVar93 = ((*(float *)(uVar13 + 0xfc) * fVar27 + fVar74) - fVar97) * fVar59;
            fVar75 = ((fVar74 + *(float *)(uVar13 + 0x100) * fVar27) - fVar98) * fVar64;
            fVar78 = ((fVar74 + *(float *)(uVar13 + 0x104) * fVar27) - fVar99) * fVar38;
            fVar79 = ((fVar74 + *(float *)(uVar13 + 0x108) * fVar27) - fVar100) * fVar40;
            fVar74 = ((fVar74 + *(float *)(uVar13 + 0x10c) * fVar27) - fVar101) * fVar41;
            fVar63 = ((*(float *)(uVar13 + 0x120) * fVar27 + fVar73) - fVar94) * fVar63;
            fVar57 = ((*(float *)(uVar13 + 0x124) * fVar27 + fVar73) - fVar95) * fVar57;
            fVar58 = ((*(float *)(uVar13 + 0x128) * fVar27 + fVar73) - fVar96) * fVar58;
            fVar59 = ((*(float *)(uVar13 + 300) * fVar27 + fVar73) - fVar97) * fVar59;
            fVar64 = ((fVar27 * *(float *)(uVar13 + 0x130) + fVar73) - fVar98) * fVar64;
            fVar38 = ((fVar27 * *(float *)(uVar13 + 0x134) + fVar73) - fVar99) * fVar38;
            fVar40 = ((fVar27 * *(float *)(uVar13 + 0x138) + fVar73) - fVar100) * fVar40;
            fVar41 = ((fVar27 * *(float *)(uVar13 + 0x13c) + fVar73) - fVar101) * fVar41;
            auVar36._0_4_ =
                 (uint)((int)fVar63 < (int)fVar90) * (int)fVar63 |
                 (uint)((int)fVar63 >= (int)fVar90) * (int)fVar90;
            auVar36._4_4_ =
                 (uint)((int)fVar57 < (int)fVar91) * (int)fVar57 |
                 (uint)((int)fVar57 >= (int)fVar91) * (int)fVar91;
            auVar36._8_4_ =
                 (uint)((int)fVar58 < (int)fVar92) * (int)fVar58 |
                 (uint)((int)fVar58 >= (int)fVar92) * (int)fVar92;
            auVar36._12_4_ =
                 (uint)((int)fVar59 < (int)fVar93) * (int)fVar59 |
                 (uint)((int)fVar59 >= (int)fVar93) * (int)fVar93;
            auVar47._0_4_ =
                 (uint)((int)fVar64 < (int)fVar75) * (int)fVar64 |
                 (uint)((int)fVar64 >= (int)fVar75) * (int)fVar75;
            auVar47._4_4_ =
                 (uint)((int)fVar38 < (int)fVar78) * (int)fVar38 |
                 (uint)((int)fVar38 >= (int)fVar78) * (int)fVar78;
            auVar47._8_4_ =
                 (uint)((int)fVar40 < (int)fVar79) * (int)fVar40 |
                 (uint)((int)fVar40 >= (int)fVar79) * (int)fVar79;
            auVar47._12_4_ =
                 (uint)((int)fVar41 < (int)fVar74) * (int)fVar41 |
                 (uint)((int)fVar41 >= (int)fVar74) * (int)fVar74;
            auVar28 = maxps(auVar36,auVar47);
            auVar48._0_4_ =
                 (uint)((int)fVar60 < (int)fVar84) * (int)fVar60 |
                 (uint)((int)fVar60 >= (int)fVar84) * (int)fVar84;
            auVar48._4_4_ =
                 (uint)((int)fVar66 < (int)fVar86) * (int)fVar66 |
                 (uint)((int)fVar66 >= (int)fVar86) * (int)fVar86;
            auVar48._8_4_ =
                 (uint)((int)fVar65 < (int)fVar88) * (int)fVar65 |
                 (uint)((int)fVar65 >= (int)fVar88) * (int)fVar88;
            auVar48._12_4_ =
                 (uint)((int)fVar67 < (int)fVar89) * (int)fVar67 |
                 (uint)((int)fVar67 >= (int)fVar89) * (int)fVar89;
            auVar82._0_4_ =
                 (uint)((int)fVar60 < (int)fVar84) * (int)fVar84 |
                 (uint)((int)fVar60 >= (int)fVar84) * (int)fVar60;
            auVar82._4_4_ =
                 (uint)((int)fVar66 < (int)fVar86) * (int)fVar86 |
                 (uint)((int)fVar66 >= (int)fVar86) * (int)fVar66;
            auVar82._8_4_ =
                 (uint)((int)fVar65 < (int)fVar88) * (int)fVar88 |
                 (uint)((int)fVar65 >= (int)fVar88) * (int)fVar65;
            auVar82._12_4_ =
                 (uint)((int)fVar67 < (int)fVar89) * (int)fVar89 |
                 (uint)((int)fVar67 >= (int)fVar89) * (int)fVar67;
            auVar80._0_4_ =
                 (uint)((int)fVar63 < (int)fVar90) * (int)fVar90 |
                 (uint)((int)fVar63 >= (int)fVar90) * (int)fVar63;
            auVar80._4_4_ =
                 (uint)((int)fVar57 < (int)fVar91) * (int)fVar91 |
                 (uint)((int)fVar57 >= (int)fVar91) * (int)fVar57;
            auVar80._8_4_ =
                 (uint)((int)fVar58 < (int)fVar92) * (int)fVar92 |
                 (uint)((int)fVar58 >= (int)fVar92) * (int)fVar58;
            auVar80._12_4_ =
                 (uint)((int)fVar59 < (int)fVar93) * (int)fVar93 |
                 (uint)((int)fVar59 >= (int)fVar93) * (int)fVar59;
            auVar11._4_4_ = fVar5;
            auVar11._0_4_ = fVar5;
            auVar11._8_4_ = fVar5;
            auVar11._12_4_ = fVar5;
            auVar42._0_4_ =
                 (uint)((int)fVar64 < (int)fVar75) * (int)fVar75 |
                 (uint)((int)fVar64 >= (int)fVar75) * (int)fVar64;
            auVar42._4_4_ =
                 (uint)((int)fVar38 < (int)fVar78) * (int)fVar78 |
                 (uint)((int)fVar38 >= (int)fVar78) * (int)fVar38;
            auVar42._8_4_ =
                 (uint)((int)fVar40 < (int)fVar79) * (int)fVar79 |
                 (uint)((int)fVar40 >= (int)fVar79) * (int)fVar40;
            auVar42._12_4_ =
                 (uint)((int)fVar41 < (int)fVar74) * (int)fVar74 |
                 (uint)((int)fVar41 >= (int)fVar74) * (int)fVar41;
            auVar29 = minps(auVar80,auVar42);
            auVar49 = maxps(auVar77,auVar48);
            auVar49 = maxps(auVar49,auVar28);
            auVar28 = minps(auVar11,auVar82);
            auVar28 = minps(auVar28,auVar29);
            auVar43._4_4_ = -(uint)(auVar49._4_4_ <= auVar28._4_4_);
            auVar43._0_4_ = -(uint)(auVar49._0_4_ <= auVar28._0_4_);
            auVar43._8_4_ = -(uint)(auVar49._8_4_ <= auVar28._8_4_);
            auVar43._12_4_ = -(uint)(auVar49._12_4_ <= auVar28._12_4_);
            uVar23 = movmskps((int)unaff_R15,auVar43);
            unaff_R15 = CONCAT44(uVar24,uVar23);
          }
          else {
            pfVar3 = (float *)(uVar13 + 0x80 + uVar20);
            pfVar1 = (float *)(uVar13 + 0x20 + uVar20);
            pfVar4 = (float *)(uVar13 + 0x80 + uVar21);
            pfVar2 = (float *)(uVar13 + 0x20 + uVar21);
            auVar31._0_4_ = ((*pfVar3 * fVar27 + *pfVar1) - fVar37) * fVar26;
            auVar31._4_4_ = ((pfVar3[1] * fVar27 + pfVar1[1]) - fVar37) * fVar26;
            auVar31._8_4_ = ((pfVar3[2] * fVar27 + pfVar1[2]) - fVar37) * fVar26;
            auVar31._12_4_ = ((pfVar3[3] * fVar27 + pfVar1[3]) - fVar37) * fVar26;
            auVar44._0_4_ = ((*pfVar4 * fVar27 + *pfVar2) - fVar39) * fVar71;
            auVar44._4_4_ = ((pfVar4[1] * fVar27 + pfVar2[1]) - fVar39) * fVar71;
            auVar44._8_4_ = ((pfVar4[2] * fVar27 + pfVar2[2]) - fVar39) * fVar71;
            auVar44._12_4_ = ((pfVar4[3] * fVar27 + pfVar2[3]) - fVar39) * fVar71;
            pfVar2 = (float *)(uVar13 + 0x80 + uVar22);
            pfVar1 = (float *)(uVar13 + 0x20 + uVar22);
            auVar51._0_4_ = ((*pfVar2 * fVar27 + *pfVar1) - fVar68) * fVar72;
            auVar51._4_4_ = ((pfVar2[1] * fVar27 + pfVar1[1]) - fVar68) * fVar72;
            auVar51._8_4_ = ((pfVar2[2] * fVar27 + pfVar1[2]) - fVar68) * fVar72;
            auVar51._12_4_ = ((pfVar2[3] * fVar27 + pfVar1[3]) - fVar68) * fVar72;
            auVar28 = maxps(auVar44,auVar51);
            pfVar2 = (float *)(uVar13 + 0x80 + (uVar20 ^ 0x10));
            pfVar1 = (float *)(uVar13 + 0x20 + (uVar20 ^ 0x10));
            auVar52._0_4_ = ((*pfVar2 * fVar27 + *pfVar1) - fVar37) * fVar26;
            auVar52._4_4_ = ((pfVar2[1] * fVar27 + pfVar1[1]) - fVar37) * fVar26;
            auVar52._8_4_ = ((pfVar2[2] * fVar27 + pfVar1[2]) - fVar37) * fVar26;
            auVar52._12_4_ = ((pfVar2[3] * fVar27 + pfVar1[3]) - fVar37) * fVar26;
            pfVar2 = (float *)(uVar13 + 0x80 + (uVar21 ^ 0x10));
            pfVar1 = (float *)(uVar13 + 0x20 + (uVar21 ^ 0x10));
            auVar62._0_4_ = ((*pfVar2 * fVar27 + *pfVar1) - fVar39) * fVar71;
            auVar62._4_4_ = ((pfVar2[1] * fVar27 + pfVar1[1]) - fVar39) * fVar71;
            auVar62._8_4_ = ((pfVar2[2] * fVar27 + pfVar1[2]) - fVar39) * fVar71;
            auVar62._12_4_ = ((pfVar2[3] * fVar27 + pfVar1[3]) - fVar39) * fVar71;
            pfVar2 = (float *)(uVar13 + 0x80 + (uVar22 ^ 0x10));
            pfVar1 = (float *)(uVar13 + 0x20 + (uVar22 ^ 0x10));
            auVar54._0_4_ = ((*pfVar2 * fVar27 + *pfVar1) - fVar68) * fVar72;
            auVar54._4_4_ = ((pfVar2[1] * fVar27 + pfVar1[1]) - fVar68) * fVar72;
            auVar54._8_4_ = ((pfVar2[2] * fVar27 + pfVar1[2]) - fVar68) * fVar72;
            auVar54._12_4_ = ((pfVar2[3] * fVar27 + pfVar1[3]) - fVar68) * fVar72;
            auVar29 = minps(auVar62,auVar54);
            auVar49 = maxps(auVar77,auVar31);
            auVar49 = maxps(auVar49,auVar28);
            auVar32._4_4_ = fVar5;
            auVar32._0_4_ = fVar5;
            auVar32._8_4_ = fVar5;
            auVar32._12_4_ = fVar5;
            auVar28 = minps(auVar32,auVar52);
            auVar28 = minps(auVar28,auVar29);
            bVar7 = auVar49._0_4_ <= auVar28._0_4_;
            bVar8 = auVar49._4_4_ <= auVar28._4_4_;
            bVar9 = auVar49._8_4_ <= auVar28._8_4_;
            bVar10 = auVar49._12_4_ <= auVar28._12_4_;
            if (uVar16 == 6) {
              bVar7 = (fVar27 < *(float *)(uVar13 + 0xf0) && *(float *)(uVar13 + 0xe0) <= fVar27) &&
                      bVar7;
              bVar8 = (fVar27 < *(float *)(uVar13 + 0xf4) && *(float *)(uVar13 + 0xe4) <= fVar27) &&
                      bVar8;
              bVar9 = (fVar27 < *(float *)(uVar13 + 0xf8) && *(float *)(uVar13 + 0xe8) <= fVar27) &&
                      bVar9;
              bVar10 = (fVar27 < *(float *)(uVar13 + 0xfc) && *(float *)(uVar13 + 0xec) <= fVar27)
                       && bVar10;
            }
            auVar55._0_4_ = (uint)bVar7 * -0x80000000;
            auVar55._4_4_ = (uint)bVar8 * -0x80000000;
            auVar55._8_4_ = (uint)bVar9 * -0x80000000;
            auVar55._12_4_ = (uint)bVar10 * -0x80000000;
            uVar23 = movmskps((int)unaff_R15,auVar55);
            unaff_R15 = CONCAT44(uVar24,uVar23);
          }
        }
        if ((uVar15 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar25 = 4;
          }
          else {
            uVar13 = uVar15 & 0xfffffffffffffff0;
            lVar18 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
            iVar25 = 0;
            uVar15 = *(ulong *)(uVar13 + lVar18 * 8);
            uVar17 = unaff_R15 - 1 & unaff_R15;
            if (uVar17 != 0) {
              pNVar19->ptr = uVar15;
              lVar18 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                }
              }
              uVar14 = uVar17 - 1;
              while( true ) {
                pNVar19 = pNVar19 + 1;
                uVar15 = *(ulong *)(uVar13 + lVar18 * 8);
                uVar14 = uVar14 & uVar17;
                if (uVar14 == 0) break;
                pNVar19->ptr = uVar15;
                lVar18 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                  }
                }
                uVar17 = uVar14 - 1;
              }
            }
          }
        }
        else {
          iVar25 = 6;
        }
      } while (iVar25 == 0);
      if (iVar25 == 6) {
        cVar12 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 8))
                           (&pre,ray,context);
        iVar25 = 0;
        if (cVar12 != '\0') {
          ray->tfar = -INFINITY;
          iVar25 = 3;
        }
      }
    } while (iVar25 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }